

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O0

void Abc_SclLibFree(SC_Lib *p)

{
  int iVar1;
  SC_WireLoad *p_00;
  SC_WireLoadSel *p_01;
  SC_TableTempl *p_02;
  SC_Cell *p_03;
  int local_34;
  int i;
  SC_Cell *pCell;
  SC_TableTempl *pTempl;
  SC_WireLoadSel *pWLS;
  SC_WireLoad *pWL;
  SC_Lib *p_local;
  
  for (local_34 = 0; iVar1 = Vec_PtrSize(&p->vWireLoads), local_34 < iVar1; local_34 = local_34 + 1)
  {
    p_00 = (SC_WireLoad *)Vec_PtrEntry(&p->vWireLoads,local_34);
    Abc_SclWireLoadFree(p_00);
  }
  Vec_PtrErase(&p->vWireLoads);
  for (local_34 = 0; iVar1 = Vec_PtrSize(&p->vWireLoadSels), local_34 < iVar1;
      local_34 = local_34 + 1) {
    p_01 = (SC_WireLoadSel *)Vec_PtrEntry(&p->vWireLoadSels,local_34);
    Abc_SclWireLoadSelFree(p_01);
  }
  Vec_PtrErase(&p->vWireLoadSels);
  for (local_34 = 0; iVar1 = Vec_PtrSize(&p->vTempls), local_34 < iVar1; local_34 = local_34 + 1) {
    p_02 = (SC_TableTempl *)Vec_PtrEntry(&p->vTempls,local_34);
    Abc_SclTableTemplFree(p_02);
  }
  Vec_PtrErase(&p->vTempls);
  for (local_34 = 0; iVar1 = Vec_PtrSize(&p->vCells), local_34 < iVar1; local_34 = local_34 + 1) {
    p_03 = (SC_Cell *)Vec_PtrEntry(&p->vCells,local_34);
    Abc_SclCellFree(p_03);
  }
  Vec_PtrErase(&p->vCells);
  Vec_PtrErase(&p->vCellClasses);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pFileName != (char *)0x0) {
    free(p->pFileName);
    p->pFileName = (char *)0x0;
  }
  if (p->default_wire_load != (char *)0x0) {
    free(p->default_wire_load);
    p->default_wire_load = (char *)0x0;
  }
  if (p->default_wire_load_sel != (char *)0x0) {
    free(p->default_wire_load_sel);
    p->default_wire_load_sel = (char *)0x0;
  }
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  if (p != (SC_Lib *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Abc_SclLibFree( SC_Lib * p )
{
    SC_WireLoad * pWL;
    SC_WireLoadSel * pWLS;
    SC_TableTempl * pTempl;
    SC_Cell * pCell;
    int i;
    SC_LibForEachWireLoad( p, pWL, i )
        Abc_SclWireLoadFree( pWL );
    Vec_PtrErase( &p->vWireLoads );
    SC_LibForEachWireLoadSel( p, pWLS, i )
        Abc_SclWireLoadSelFree( pWLS );
    Vec_PtrErase( &p->vWireLoadSels );
    SC_LibForEachTempl( p, pTempl, i )
        Abc_SclTableTemplFree( pTempl );
    Vec_PtrErase( &p->vTempls );
    SC_LibForEachCell( p, pCell, i )
        Abc_SclCellFree( pCell );
    Vec_PtrErase( &p->vCells );
    Vec_PtrErase( &p->vCellClasses );
    ABC_FREE( p->pName );
    ABC_FREE( p->pFileName );
    ABC_FREE( p->default_wire_load );
    ABC_FREE( p->default_wire_load_sel );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}